

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O1

void clone_mobile(CHAR_DATA *parent,CHAR_DATA *clone)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  CClass *pCVar4;
  long lVar5;
  AFFECT_DATA *pAVar6;
  
  if ((clone != (CHAR_DATA *)0x0 && parent != (CHAR_DATA *)0x0) && (cVar1 = is_npc(), cVar1 != '\0')
     ) {
    pcVar3 = (char *)palloc_string(parent->name);
    clone->name = pcVar3;
    clone->version = parent->version;
    pcVar3 = (char *)palloc_string(parent->short_descr);
    clone->short_descr = pcVar3;
    pcVar3 = (char *)palloc_string(parent->long_descr);
    clone->long_descr = pcVar3;
    pcVar3 = (char *)palloc_string(parent->description);
    clone->description = pcVar3;
    clone->group = parent->group;
    clone->sex = parent->sex;
    if ((parent->my_class == (CClass *)0x0) &&
       ((parent->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (parent->pIndexData->my_class == (CClass *)0x0)))) {
      CClass::GetClass(0);
    }
    iVar2 = CClass::GetIndex();
    pCVar4 = (CClass *)CClass::GetClass(iVar2);
    clone->my_class = pCVar4;
    clone->race = parent->race;
    clone->level = parent->level;
    clone->trust = 0;
    clone->timer = parent->timer;
    clone->wait = parent->wait;
    clone->hit = parent->hit;
    clone->max_hit = parent->max_hit;
    clone->mana = parent->mana;
    clone->max_mana = parent->max_mana;
    clone->move = parent->move;
    clone->max_move = parent->max_move;
    clone->gold = parent->gold;
    clone->exp = parent->exp;
    copy_vector(clone->act,parent->act);
    copy_vector(clone->comm,parent->comm);
    copy_vector(clone->imm_flags,parent->imm_flags);
    copy_vector(clone->res_flags,parent->res_flags);
    copy_vector(clone->vuln_flags,parent->vuln_flags);
    clone->invis_level = parent->invis_level;
    copy_vector(clone->affected_by,parent->affected_by);
    clone->position = parent->position;
    clone->practice = parent->practice;
    clone->train = parent->train;
    clone->saving_throw = parent->saving_throw;
    clone->alignment = parent->alignment;
    clone->hitroll = parent->hitroll;
    clone->damroll = parent->damroll;
    clone->wimpy = parent->wimpy;
    copy_vector(clone->form,parent->form);
    copy_vector(clone->parts,parent->parts);
    clone->size = parent->size;
    copy_vector(clone->off_flags,parent->off_flags);
    clone->dam_type = parent->dam_type;
    clone->start_pos = parent->start_pos;
    clone->dam_mod = parent->dam_mod;
    clone->defense_mod = parent->defense_mod;
    clone->cabal = parent->cabal;
    clone->arms = parent->arms;
    clone->legs = parent->legs;
    lVar5 = 0x105;
    do {
      *(undefined2 *)((long)&clone->next + lVar5 * 2) =
           *(undefined2 *)((long)&parent->next + lVar5 * 2);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x109);
    lVar5 = 0x134;
    do {
      *(undefined2 *)((long)&clone->next + lVar5 * 2) =
           *(undefined2 *)((long)&parent->next + lVar5 * 2);
      *(undefined2 *)((long)&clone->next_in_room + lVar5 * 2 + 2) =
           *(undefined2 *)((long)&parent->next_in_room + lVar5 * 2 + 2);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x139);
    lVar5 = 0x168;
    do {
      *(undefined2 *)((long)&clone->next + lVar5 * 2) =
           *(undefined2 *)((long)&parent->next + lVar5 * 2);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x16b);
    for (pAVar6 = parent->affected; pAVar6 != (affect_data *)0x0; pAVar6 = pAVar6->next) {
      affect_to_char(clone,pAVar6);
    }
  }
  return;
}

Assistant:

void clone_mobile(CHAR_DATA *parent, CHAR_DATA *clone)
{
	int i;
	AFFECT_DATA *paf;

	if (parent == nullptr || clone == nullptr || !is_npc(parent))
		return;

	/* start fixing values */
	clone->name = palloc_string(parent->name);
	clone->version = parent->version;
	clone->short_descr = palloc_string(parent->short_descr);
	clone->long_descr = palloc_string(parent->long_descr);
	clone->description = palloc_string(parent->description);
	clone->group = parent->group;
	clone->sex = parent->sex;
	clone->SetClass(parent->Class()->GetIndex());
	clone->race = parent->race;
	clone->level = parent->level;
	clone->trust = 0;
	clone->timer = parent->timer;
	clone->wait = parent->wait;
	clone->hit = parent->hit;
	clone->max_hit = parent->max_hit;
	clone->mana = parent->mana;
	clone->max_mana = parent->max_mana;
	clone->move = parent->move;
	clone->max_move = parent->max_move;
	clone->gold = parent->gold;
	clone->exp = parent->exp;

	copy_vector(clone->act, parent->act);
	copy_vector(clone->comm, parent->comm);
	copy_vector(clone->imm_flags, parent->imm_flags);
	copy_vector(clone->res_flags, parent->res_flags);
	copy_vector(clone->vuln_flags, parent->vuln_flags);

	clone->invis_level = parent->invis_level;

	copy_vector(clone->affected_by, parent->affected_by);

	clone->position = parent->position;
	clone->practice = parent->practice;
	clone->train = parent->train;
	clone->saving_throw = parent->saving_throw;
	clone->alignment = parent->alignment;
	clone->hitroll = parent->hitroll;
	clone->damroll = parent->damroll;
	clone->wimpy = parent->wimpy;

	copy_vector(clone->form, parent->form);
	copy_vector(clone->parts, parent->parts);

	clone->size = parent->size;

	copy_vector(clone->off_flags, parent->off_flags);

	clone->dam_type = parent->dam_type;
	clone->start_pos = parent->start_pos;
	clone->dam_mod = parent->dam_mod;
	clone->defense_mod = parent->defense_mod;
	clone->cabal = parent->cabal;
	clone->arms = parent->arms;
	clone->legs = parent->legs;

	for (i = 0; i < 4; i++)
	{
		clone->armor[i] = parent->armor[i];
	}

	for (i = 0; i < MAX_STATS; i++)
	{
		clone->perm_stat[i] = parent->perm_stat[i];
		clone->mod_stat[i] = parent->mod_stat[i];
	}

	for (i = 0; i < 3; i++)
	{
		clone->damage[i] = parent->damage[i];
	}

	/* now add the affects */
	for (paf = parent->affected; paf != nullptr; paf = paf->next)
	{
		affect_to_char(clone, paf);
	}
}